

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::optimizeBinaryWithEqualEffectlessChildren
          (OptimizeInstructions *this,Binary *binary)

{
  Module *pMVar1;
  Type local_38;
  Type local_30;
  Type local_28;
  Binary *local_20;
  Binary *binary_local;
  OptimizeInstructions *this_local;
  
  local_20 = binary;
  binary_local = (Binary *)this;
  switch(binary->op) {
  case SubInt32:
  case XorInt32:
  case SubInt64:
  case XorInt64:
    local_28.id = (binary->left->type).id;
    pMVar1 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    this_local = (OptimizeInstructions *)LiteralUtils::makeZero(local_28,pMVar1);
    break;
  default:
    this_local = (OptimizeInstructions *)0x0;
    break;
  case AndInt32:
  case OrInt32:
  case AndInt64:
  case OrInt64:
    this_local = (OptimizeInstructions *)binary->left;
    break;
  case EqInt32:
  case LeSInt32:
  case LeUInt32:
  case GeSInt32:
  case GeUInt32:
  case EqInt64:
  case LeSInt64:
  case LeUInt64:
  case GeSInt64:
  case GeUInt64:
    wasm::Type::Type(&local_38,i32);
    pMVar1 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    this_local = (OptimizeInstructions *)LiteralUtils::makeFromInt32(1,local_38,pMVar1);
    break;
  case NeInt32:
  case LtSInt32:
  case LtUInt32:
  case GtSInt32:
  case GtUInt32:
  case NeInt64:
  case LtSInt64:
  case LtUInt64:
  case GtSInt64:
  case GtUInt64:
    wasm::Type::Type(&local_30,i32);
    pMVar1 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    this_local = (OptimizeInstructions *)LiteralUtils::makeZero(local_30,pMVar1);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* optimizeBinaryWithEqualEffectlessChildren(Binary* binary) {
    // TODO add: perhaps worth doing 2*x if x is quite large?
    switch (binary->op) {
      case SubInt32:
      case XorInt32:
      case SubInt64:
      case XorInt64:
        return LiteralUtils::makeZero(binary->left->type, *getModule());
      case NeInt32:
      case LtSInt32:
      case LtUInt32:
      case GtSInt32:
      case GtUInt32:
      case NeInt64:
      case LtSInt64:
      case LtUInt64:
      case GtSInt64:
      case GtUInt64:
        return LiteralUtils::makeZero(Type::i32, *getModule());
      case AndInt32:
      case OrInt32:
      case AndInt64:
      case OrInt64:
        return binary->left;
      case EqInt32:
      case LeSInt32:
      case LeUInt32:
      case GeSInt32:
      case GeUInt32:
      case EqInt64:
      case LeSInt64:
      case LeUInt64:
      case GeSInt64:
      case GeUInt64:
        return LiteralUtils::makeFromInt32(1, Type::i32, *getModule());
      default:
        return nullptr;
    }
  }